

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::
abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~abstract_value(abstract_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__abstract_value_0042fd40;
  std::__cxx11::string::~string((string *)(in_RDI + 0xb));
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1ad6d6);
  Value::~Value((Value *)0x1ad6e0);
  return;
}

Assistant:

~abstract_value() override = default;